

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *pvVar5;
  char *__s1;
  undefined1 auVar6 [16];
  float fVar7;
  char **ppcVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  Allocator AVar13;
  FILE *pFVar14;
  byte bVar15;
  _Any_data *onError;
  undefined8 uVar16;
  int iVar17;
  _Alloc_hider _Var18;
  int c;
  int iVar19;
  Point2i p;
  char *pcVar20;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_R9;
  int iVar21;
  uint64_t oldstate;
  ulong uVar22;
  long lVar23;
  int iVar24;
  undefined1 auVar25 [16];
  Float FVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 in_XMM3 [16];
  span<int> out;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  int nInstances;
  int width;
  char **argv_local;
  array<int,_2UL> pixel;
  int local_478;
  int vb;
  Float sigma;
  string filename;
  int va;
  undefined4 uStack_434;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  ImageChannelDesc rgbDesc;
  _Any_data local_3e8;
  code *local_3d8;
  code *local_3d0;
  _Any_data local_3c8;
  code *local_3b8;
  code *local_3b0;
  _Any_data local_3a8;
  code *local_398;
  code *local_390;
  undefined8 local_388;
  undefined8 uStack_380;
  code *local_378;
  code *local_370;
  ColorEncodingHandle local_368;
  Image image;
  ImageAndMetadata imRead;
  undefined1 extraout_var [60];
  
  puVar1 = (undefined1 *)((long)&imRead.image.channelNames.field_2 + 0x18);
  puVar2 = (undefined1 *)((long)&imRead.image.channelNames.field_2 + 0x38);
  puVar3 = (undefined1 *)((long)&imRead.image.channelNames.field_2 + 0x58);
  puVar4 = (undefined1 *)((long)&imRead.image.channelNames.field_2 + 0x78);
  pvVar5 = &imRead.image.p8;
  imRead.image.format = U256;
  imRead.image.resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
  imRead.image.resolution.super_Tuple2<pbrt::Point2,_int>.y = 0;
  imRead.image._12_4_ = 0;
  imRead.image.channelNames.alloc.memoryResource = (memory_resource *)0x100000001;
  imRead.image.channelNames.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  imRead.image.channelNames.field_2.fixed[0]._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
  imRead.image.channelNames.field_2._16_8_ = 0;
  imRead.image.channelNames.field_2._24_1_ = 0;
  imRead.image.channelNames.field_2._48_8_ = 0;
  imRead.image.channelNames.field_2._56_1_ = 0;
  imRead.image.channelNames.field_2._80_8_ = 0;
  imRead.image.channelNames.field_2._88_1_ = 0;
  imRead.image.channelNames.field_2._112_8_ = 0;
  imRead.image.channelNames.field_2._120_1_ = 0;
  imRead.image.encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  imRead.image.p8.alloc.memoryResource._0_1_ = 0;
  imRead.image.p16.nAlloc = 0;
  imRead.image._200_32_ = ZEXT432(0) << 0x40;
  argv_local = argv;
  imRead.image.channelNames.field_2.fixed[0]._M_string_length = (size_type)puVar1;
  imRead.image.channelNames.field_2.fixed[1]._M_string_length = (size_type)puVar2;
  imRead.image.channelNames.field_2.fixed[2]._M_string_length = (size_type)puVar3;
  imRead.image.channelNames.field_2.fixed[3]._M_string_length = (size_type)puVar4;
  imRead.image.channelNames.nStored = (size_t)pvVar5;
  pbrt::InitPBRT((PBRTOptions *)&imRead);
  if (imRead.image.p16.nAlloc._4_1_ == '\x01') {
    imRead.image.p16.nAlloc._0_5_ = CONCAT14(0,(uint)imRead.image.p16.nAlloc);
  }
  if ((char)imRead.image.p16.alloc.memoryResource == '\x01') {
    imRead.image.p16.alloc.memoryResource._0_1_ = 0;
  }
  if ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
      imRead.image.channelNames.nStored != pvVar5) {
    operator_delete((void *)imRead.image.channelNames.nStored,
                    CONCAT71(imRead.image.p8.alloc.memoryResource._1_7_,
                             imRead.image.p8.alloc.memoryResource._0_1_) + 1);
  }
  if ((undefined1 *)imRead.image.channelNames.field_2.fixed[3]._M_string_length != puVar4) {
    operator_delete((void *)imRead.image.channelNames.field_2.fixed[3]._M_string_length,
                    CONCAT71(imRead.image.channelNames.field_2._121_7_,
                             imRead.image.channelNames.field_2._120_1_) + 1);
  }
  if ((undefined1 *)imRead.image.channelNames.field_2.fixed[2]._M_string_length != puVar3) {
    operator_delete((void *)imRead.image.channelNames.field_2.fixed[2]._M_string_length,
                    CONCAT71(imRead.image.channelNames.field_2._89_7_,
                             imRead.image.channelNames.field_2._88_1_) + 1);
  }
  if ((undefined1 *)imRead.image.channelNames.field_2.fixed[1]._M_string_length != puVar2) {
    operator_delete((void *)imRead.image.channelNames.field_2.fixed[1]._M_string_length,
                    CONCAT71(imRead.image.channelNames.field_2._57_7_,
                             imRead.image.channelNames.field_2._56_1_) + 1);
  }
  if ((undefined1 *)imRead.image.channelNames.field_2.fixed[0]._M_string_length != puVar1) {
    operator_delete((void *)imRead.image.channelNames.field_2.fixed[0]._M_string_length,
                    CONCAT71(imRead.image.channelNames.field_2._25_7_,
                             imRead.image.channelNames.field_2._24_1_) + 1);
  }
  ppcVar8 = argv_local;
  if (argc < 2) {
    help();
  }
  else {
    __s1 = argv_local[1];
    pcVar20 = __s1;
    iVar11 = strcmp(__s1,"average");
    if (iVar11 == 0) {
      iVar11 = average((int)pcVar20,ppcVar8 + 2);
      return iVar11;
    }
    iVar11 = strcmp(__s1,"assemble");
    if (iVar11 == 0) {
      assemble(argc + -2,ppcVar8 + 2);
    }
    else {
      pcVar20 = __s1;
      iVar11 = strcmp(__s1,"bloom");
      if (iVar11 == 0) {
        iVar11 = bloom((int)pcVar20,ppcVar8 + 2);
        return iVar11;
      }
      iVar11 = strcmp(__s1,"cat");
      if (iVar11 == 0) {
        iVar11 = cat(argc + -2,ppcVar8 + 2);
        return iVar11;
      }
      pcVar20 = __s1;
      iVar11 = strcmp(__s1,"convert");
      if (iVar11 == 0) {
        iVar11 = convert((int)pcVar20,ppcVar8 + 2);
        return iVar11;
      }
      pcVar20 = __s1;
      iVar11 = strcmp(__s1,"diff");
      if (iVar11 == 0) {
        iVar11 = diff((int)pcVar20,ppcVar8 + 2);
        return iVar11;
      }
      pcVar20 = __s1;
      iVar11 = strcmp(__s1,"denoise");
      if (iVar11 == 0) {
        iVar11 = denoise((int)pcVar20,ppcVar8 + 2);
        return iVar11;
      }
      pcVar20 = __s1;
      iVar11 = strcmp(__s1,"error");
      if (iVar11 == 0) {
        iVar11 = error((int)pcVar20,ppcVar8 + 2);
        return iVar11;
      }
      pcVar20 = __s1;
      iVar11 = strcmp(__s1,"falsecolor");
      if (iVar11 == 0) {
        iVar11 = falsecolor((int)pcVar20,ppcVar8 + 2);
        return iVar11;
      }
      iVar11 = strcmp(__s1,"help");
      if ((((iVar11 == 0) || (iVar11 = strcmp(__s1,"-help"), iVar11 == 0)) ||
          (iVar11 = strcmp(__s1,"--help"), iVar11 == 0)) ||
         (((*__s1 == '-' && (__s1[1] == 'h')) && (__s1[2] == '\0')))) {
        iVar11 = help(argc + -2,ppcVar8 + 2);
        return iVar11;
      }
      iVar11 = strcmp(__s1,"info");
      if (iVar11 == 0) {
        info(argc + -2,ppcVar8 + 2);
      }
      else {
        pcVar20 = __s1;
        iVar11 = strcmp(__s1,"makeenv");
        if (iVar11 == 0) {
          makeenv((int)pcVar20,ppcVar8 + 2);
        }
        else {
          pcVar20 = __s1;
          iVar11 = strcmp(__s1,"makeemitters");
          if (iVar11 == 0) {
            iVar11 = makeemitters((int)pcVar20,ppcVar8 + 2);
            return iVar11;
          }
          pcVar20 = __s1;
          iVar11 = strcmp(__s1,"makesky");
          if (iVar11 != 0) {
            pcVar20 = __s1;
            iVar11 = strcmp(__s1,"whitebalance");
            if (iVar11 == 0) {
              iVar11 = whitebalance((int)pcVar20,ppcVar8 + 2);
              return iVar11;
            }
            iVar11 = strcmp(__s1,"noisybit");
            if (iVar11 != 0) {
              main_cold_1();
              return 1;
            }
            argv_local = ppcVar8 + 2;
            filename._M_dataplus._M_p = (pointer)&filename.field_2;
            width = 10;
            sigma = 1.0;
            nInstances = 100;
            filename._M_string_length = 0;
            filename.field_2._M_local_buf[0] = '\0';
            pixel._M_elems[0] = 0;
            pixel._M_elems[1] = 0;
            if (ppcVar8[2] != (char *)0x0) {
              do {
                imRead.image._0_8_ = &imRead.image.channelNames;
                std::__cxx11::string::_M_construct<char_const*>((string *)&imRead,"pixel","");
                local_388 = 0;
                uStack_380 = 0;
                local_370 = std::
                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:2296:28)>
                            ::_M_invoke;
                local_378 = std::
                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:2296:28)>
                            ::_M_manager;
                out.n = (size_t)&local_388;
                out.ptr = (int *)0x2;
                onError = (_Any_data *)0x2;
                bVar9 = pbrt::ParseArg<pstd::span<int>>
                                  ((pbrt *)&argv_local,(char ***)&imRead,(string *)&pixel,out,in_R9)
                ;
                bVar10 = true;
                if (!bVar9) {
                  image._0_8_ = &image.channelNames;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&image,"width","");
                  local_3a8._M_unused._M_object = (void *)0x0;
                  local_3a8._8_8_ = 0;
                  local_390 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:2296:28)>
                              ::_M_invoke;
                  local_398 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:2296:28)>
                              ::_M_manager;
                  onError = &local_3a8;
                  bVar9 = pbrt::ParseArg<int*>
                                    (&argv_local,(string *)&image,&width,
                                     (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                      *)onError);
                  bVar10 = true;
                  if (!bVar9) {
                    rgbDesc.offset.alloc.memoryResource = (memory_resource *)&rgbDesc.offset.field_2
                    ;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&rgbDesc,"sigma","");
                    local_3c8._M_unused._M_object = (void *)0x0;
                    local_3c8._8_8_ = 0;
                    local_3b0 = std::
                                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:2296:28)>
                                ::_M_invoke;
                    local_3b8 = std::
                                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:2296:28)>
                                ::_M_manager;
                    onError = &local_3c8;
                    bVar9 = pbrt::ParseArg<float*>
                                      (&argv_local,(string *)&rgbDesc,&sigma,
                                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                        *)onError);
                    bVar10 = true;
                    if (!bVar9) {
                      _va = (pointer)&local_428;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&va,"n","");
                      local_3e8._M_unused._M_object = (void *)0x0;
                      local_3e8._8_8_ = 0;
                      local_3d0 = std::
                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:2296:28)>
                                  ::_M_invoke;
                      local_3d8 = std::
                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:2296:28)>
                                  ::_M_manager;
                      onError = &local_3e8;
                      bVar10 = pbrt::ParseArg<int*>
                                         (&argv_local,(string *)&va,&nInstances,
                                          (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                           *)onError);
                      if (local_3d8 != (code *)0x0) {
                        (*local_3d8)(&local_3e8,&local_3e8,__destroy_functor);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_va != &local_428) {
                        operator_delete(_va,local_428._M_allocated_capacity + 1);
                      }
                    }
                    if (local_3b8 != (code *)0x0) {
                      (*local_3b8)(&local_3c8,&local_3c8,__destroy_functor);
                    }
                    if ((anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                         *)rgbDesc.offset.alloc.memoryResource != &rgbDesc.offset.field_2) {
                      operator_delete(rgbDesc.offset.alloc.memoryResource,
                                      rgbDesc.offset.field_2._0_8_ + 1);
                    }
                  }
                  if (local_398 != (code *)0x0) {
                    (*local_398)(&local_3a8,&local_3a8,__destroy_functor);
                  }
                  if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)image._0_8_ != &image.channelNames) {
                    operator_delete((void *)image._0_8_,
                                    (ulong)((long)&(image.channelNames.alloc.memoryResource)->
                                                   _vptr_memory_resource + 1));
                  }
                }
                if (local_378 != (code *)0x0) {
                  (*local_378)(&local_388,&local_388,3);
                }
                if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)imRead.image._0_8_ != &imRead.image.channelNames) {
                  operator_delete((void *)imRead.image._0_8_,
                                  (ulong)((long)&(imRead.image.channelNames.alloc.memoryResource)->
                                                 _vptr_memory_resource + 1));
                }
                if (bVar10 == false) {
                  if (filename._M_string_length != 0) {
                    pbrt::StringPrintf<char*&>
                              ((string *)&imRead,(pbrt *)"unexpected argument \"%s\"",
                               (char *)argv_local,(char **)onError);
                    usage("%s",(char *)imRead.image._0_8_);
                  }
                  std::__cxx11::string::operator=((string *)&filename,*argv_local);
                  argv_local = argv_local + 1;
                }
              } while (*argv_local != (char *)0x0);
              if (filename._M_string_length != 0) {
                AVar13.memoryResource = pstd::pmr::new_delete_resource();
                local_368.
                super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                         )0;
                pbrt::Image::Read(&imRead,&filename,AVar13,&local_368);
                image._0_8_ = &image.channelNames;
                std::__cxx11::string::_M_construct<char_const*>((string *)&image,"R","");
                image.channelNames.field_2.fixed[0]._M_dataplus._M_p =
                     (_Alloc_hider)((long)&image.channelNames.field_2 + 0x10);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&image.channelNames.field_2,"G","");
                _Var18._M_p = (pointer)((long)&image.channelNames.field_2 + 0x30);
                image.channelNames.field_2.fixed[1]._M_dataplus._M_p = (_Alloc_hider)_Var18._M_p;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)((long)&image.channelNames.field_2 + 0x20),"B","");
                requestedChannels.n = 3;
                requestedChannels.ptr =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image;
                pbrt::Image::GetChannelDesc(&rgbDesc,&imRead.image,requestedChannels);
                lVar23 = -0x60;
                do {
                  if ((long *)_Var18._M_p != *(long **)((long)_Var18._M_p + -0x10)) {
                    operator_delete(*(long **)((long)_Var18._M_p + -0x10),*(long *)_Var18._M_p + 1);
                  }
                  _Var18._M_p = _Var18._M_p + -0x20;
                  lVar23 = lVar23 + 0x20;
                } while (lVar23 != 0);
                if (rgbDesc.offset.nStored == 0) {
                  pbrt::LogFatal<char_const(&)[14]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp"
                             ,0x90b,"Check failed: %s",(char (*) [14])"(bool)rgbDesc");
                }
                AVar13.memoryResource = pstd::pmr::new_delete_resource();
                pbrt::Image::SelectChannels(&image,&imRead.image,&rgbDesc,AVar13);
                if (((pixel._M_elems[0] < width) ||
                    (image.resolution.super_Tuple2<pbrt::Point2,_int>.x <= width + pixel._M_elems[0]
                    )) || (image.resolution.super_Tuple2<pbrt::Point2,_int>.y <=
                           width + pixel._M_elems[0])) {
                  bVar9 = false;
                  fprintf(_stderr,
                          "%s: pixel (%d, %d) with width %d doesn\'t work with resolution (%d, %d).\n"
                          ,filename._M_dataplus._M_p,(ulong)pixel._M_elems & 0xffffffff,
                          (ulong)pixel._M_elems & 0xffffffff,(ulong)(uint)width,
                          CONCAT44(image.resolution.super_Tuple2<pbrt::Point2,_int>.y,
                                   image.resolution.super_Tuple2<pbrt::Point2,_int>.x),
                          (ulong)(uint)image.resolution.super_Tuple2<pbrt::Point2,_int>.y);
                }
                else {
                  iVar11 = width * 2 + 1;
                  vb = iVar11 * iVar11;
                  va = nInstances * 3;
                  if (nInstances * 3 < vb) {
                    pbrt::
                    LogFatal<char_const(&)[15],char_const(&)[8],char_const(&)[15],int&,char_const(&)[8],int&>
                              (Fatal,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp"
                               ,0x919,"Check failed: %s >= %s with %s = %s, %s = %s",
                               (char (*) [15])"3 * nInstances",(char (*) [8])"nPixels",
                               (char (*) [15])"3 * nInstances",&va,(char (*) [8])"nPixels",&vb);
                  }
                  pFVar14 = fopen("m.csv","w");
                  if (0 < nInstances) {
                    uVar22 = 0x853c49e6748fea9b;
                    local_478 = 0;
                    do {
                      iVar11 = 0;
                      do {
                        if (-1 < width) {
                          iVar19 = width;
                          iVar24 = -width;
                          do {
                            if (-1 < iVar19) {
                              iVar21 = -iVar19;
                              do {
                                uVar12 = (uint)(uVar22 >> 0x2d) ^ (uint)(uVar22 >> 0x1b);
                                bVar15 = (byte)(uVar22 >> 0x3b);
                                auVar25 = vcvtusi2ss_avx512f(in_XMM3,uVar12 >> bVar15 |
                                                                     uVar12 << 0x20 - bVar15);
                                auVar25 = vminss_avx(ZEXT416((uint)(auVar25._0_4_ * 2.3283064e-10)),
                                                     ZEXT416(0x3f7fffff));
                                auVar6 = vfmadd132ss_fma(auVar25,SUB6416(ZEXT464(0xbf800000),0),
                                                         ZEXT416(0x40000000));
                                auVar25 = vfnmadd213ss_fma(auVar6,auVar6,ZEXT416(0x3f800000));
                                auVar25 = vmaxss_avx(SUB6416(ZEXT464(0x800000),0),auVar25);
                                auVar28._0_4_ = logf(auVar25._0_4_);
                                iVar19 = width;
                                auVar28._4_60_ = extraout_var;
                                if (0x7f7fffff < (uint)ABS(auVar28._0_4_)) {
                                  pbrt::LogFatal<char_const(&)[28]>
                                            (Fatal,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math.h"
                                             ,0x2e5,"Check failed: %s",
                                             (char (*) [28])"!IsNaN(t) && !std::isinf(t)");
                                }
                                auVar25._8_4_ = 0x7fffffff;
                                auVar25._0_8_ = 0x7fffffff7fffffff;
                                auVar25._12_4_ = 0x7fffffff;
                                auVar27 = auVar28._0_16_;
                                auVar25 = vandps_avx512vl(auVar27,auVar25);
                                if (auVar25._0_4_ <= 6.125) {
                                  auVar25 = vfmadd213ss_fma(SUB6416(ZEXT464(0x31bae000),0),auVar27,
                                                            ZEXT416(0x3419da2c));
                                  auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x35a4c94e));
                                  auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x33f295dd));
                                  auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0xb86b8609));
                                  auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0xb91adf4d));
                                  auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x3b17b201));
                                  auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x3c3d0f26));
                                  auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0xbe6d9577));
                                  auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x3f62dfc4));
                                  fVar7 = auVar25._0_4_;
                                }
                                else {
                                  auVar25 = vfmadd213ss_fma(SUB6416(ZEXT464(0x2fa6f5a2),0),auVar27,
                                                            ZEXT416(0x32fbe4d7));
                                  auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x35a3f289));
                                  auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x37ee53ef));
                                  auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x39ce55c9));
                                  auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x3b46606f));
                                  auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x3b9e5490));
                                  auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0xbe877fb3));
                                  auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x3f570b52));
                                  fVar7 = auVar25._0_4_;
                                }
                                p.super_Tuple2<pbrt::Point2,_int>.x = pixel._M_elems[0] + iVar24;
                                p.super_Tuple2<pbrt::Point2,_int>.y = pixel._M_elems[1] + iVar21;
                                FVar26 = pbrt::Image::GetChannel
                                                   (&image,p,iVar11,(WrapMode2D)0x200000002);
                                iVar17 = -iVar19;
                                auVar25 = vfmadd213ss_fma(ZEXT416((uint)(fVar7 * auVar6._0_4_)),
                                                          SUB6416(ZEXT464(0x3e10d0c3),0),ZEXT416(0))
                                ;
                                uVar22 = uVar22 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
                                uVar16 = 0x20;
                                if (iVar21 != iVar17 &&
                                    SBORROW4(iVar21,iVar17) == iVar21 + iVar19 < 0) {
                                  uVar16 = 0x2c;
                                }
                                if (iVar24 != iVar17 &&
                                    SBORROW4(iVar24,iVar17) == iVar24 + iVar19 < 0) {
                                  uVar16 = 0x2c;
                                }
                                fprintf(pFVar14,"%c%f ",(double)(auVar25._0_4_ + FVar26),uVar16);
                                bVar9 = iVar21 < width;
                                iVar19 = width;
                                iVar21 = iVar21 + 1;
                              } while (bVar9);
                            }
                            bVar9 = iVar24 < iVar19;
                            iVar24 = iVar24 + 1;
                          } while (bVar9);
                        }
                        fputc(10,pFVar14);
                        iVar11 = iVar11 + 1;
                      } while (iVar11 != 3);
                      local_478 = local_478 + 1;
                    } while (local_478 < nInstances);
                  }
                  fclose(pFVar14);
                  pFVar14 = fopen("b.csv","w");
                  if (0 < nInstances) {
                    iVar11 = 0;
                    do {
                      iVar19 = 0;
                      do {
                        FVar26 = pbrt::Image::GetChannel
                                           (&image,(Point2i)pixel._M_elems,iVar19,
                                            (WrapMode2D)0x200000002);
                        fprintf(pFVar14,"%f\n",(double)FVar26);
                        iVar19 = iVar19 + 1;
                      } while (iVar19 != 3);
                      iVar11 = iVar11 + 1;
                    } while (iVar11 < nInstances);
                  }
                  fclose(pFVar14);
                  bVar9 = true;
                }
                pbrt::Image::~Image(&image);
                pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                          (&rgbDesc.offset);
                pbrt::ImageAndMetadata::~ImageAndMetadata(&imRead);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)filename._M_dataplus._M_p != &filename.field_2) {
                  operator_delete(filename._M_dataplus._M_p,
                                  CONCAT71(filename.field_2._M_allocated_capacity._1_7_,
                                           filename.field_2._M_local_buf[0]) + 1);
                }
                if (bVar9) {
                  pbrt::CleanupPBRT();
                  return 0;
                }
                return 1;
              }
            }
            pbrt::LogFatal<char_const(&)[18]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp"
                       ,0x907,"Check failed: %s",(char (*) [18])"!filename.empty()");
          }
          makesky((int)pcVar20,ppcVar8 + 2);
        }
      }
    }
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    InitPBRT({});

    if (argc < 2) {
        help();
        return 0;
    }

    if (strcmp(argv[1], "average") == 0)
        return average(argc - 2, argv + 2);
    else if (strcmp(argv[1], "assemble") == 0)
        return assemble(argc - 2, argv + 2);
    else if (strcmp(argv[1], "bloom") == 0)
        return bloom(argc - 2, argv + 2);
    else if (strcmp(argv[1], "cat") == 0)
        return cat(argc - 2, argv + 2);
    else if (strcmp(argv[1], "convert") == 0)
        return convert(argc - 2, argv + 2);
    else if (strcmp(argv[1], "diff") == 0)
        return diff(argc - 2, argv + 2);
    else if (strcmp(argv[1], "denoise") == 0)
        return denoise(argc - 2, argv + 2);
#ifdef PBRT_BUILD_GPU_RENDERER
    else if (strcmp(argv[1], "denoise-optix") == 0)
        return denoise_optix(argc - 2, argv + 2);
#endif  // PBRT_BUILD_GPU_RENDERER
    else if (strcmp(argv[1], "error") == 0)
        return error(argc - 2, argv + 2);
    else if (strcmp(argv[1], "falsecolor") == 0)
        return falsecolor(argc - 2, argv + 2);
    else if (strcmp(argv[1], "help") == 0 || strcmp(argv[1], "-help") == 0 ||
             strcmp(argv[1], "--help") == 0 || strcmp(argv[1], "-h") == 0)
        return help(argc - 2, argv + 2);
    else if (strcmp(argv[1], "info") == 0)
        return info(argc - 2, argv + 2);
    else if (strcmp(argv[1], "makeenv") == 0)
        return makeenv(argc - 2, argv + 2);
    else if (strcmp(argv[1], "makeemitters") == 0)
        return makeemitters(argc - 2, argv + 2);
    else if (strcmp(argv[1], "makesky") == 0)
        return makesky(argc - 2, argv + 2);
    else if (strcmp(argv[1], "whitebalance") == 0)
        return whitebalance(argc - 2, argv + 2);
    else if (strcmp(argv[1], "noisybit") == 0) {
        // hack for brute force comptuation of ideal filter weights.

        argv += 2;
        std::string filename;
        std::array<int, 2> pixel = {0, 0};
        int width = 10;
        Float sigma = 1;
        int nInstances = 100;

        while (*argv != nullptr) {
            auto onError = [](const std::string &err) {
                usage("%s", err.c_str());
                exit(1);
            };
            if (ParseArg(&argv, "pixel", pstd::MakeSpan(pixel), onError) ||
                ParseArg(&argv, "width", &width, onError) ||
                ParseArg(&argv, "sigma", &sigma, onError) ||
                ParseArg(&argv, "n", &nInstances, onError))
                ;  // yaay
            else if (filename.empty()) {
                filename = *argv;
                ++argv;
            } else
                onError(StringPrintf("unexpected argument \"%s\"", *argv));
        }
        CHECK(!filename.empty());

        ImageAndMetadata imRead = Image::Read(filename);
        ImageChannelDesc rgbDesc = imRead.image.GetChannelDesc({"R", "G", "B"});
        CHECK((bool)rgbDesc);
        Image image = imRead.image.SelectChannels(rgbDesc);

        if (pixel[0] - width < 0 || pixel[0] + width >= image.Resolution().x ||
            pixel[0] - width < 0 || pixel[0] + width >= image.Resolution().y) {
            fprintf(stderr,
                    "%s: pixel (%d, %d) with width %d doesn't work with "
                    "resolution (%d, %d).\n",
                    filename.c_str(), pixel[0], pixel[0], width, image.Resolution().x,
                    image.Resolution().y);
            return 1;
        }

        int nPixels = Sqr(2 * width + 1);
        CHECK_GE(3 * nInstances, nPixels);  // want to be overconstrained

        RNG rng;
        //
        FILE *f = fopen("m.csv", "w");
        for (int i = 0; i < nInstances; ++i)
            for (int c = 0; c < 3; ++c) {
                for (int dx = -width; dx <= width; ++dx)
                    for (int dy = -width; dy <= width; ++dy) {
                        // Float noise = .1 * std::exp(-rng.Uniform<Float>() *
                        // 3); if (rng.Uniform<Float>() < .5) noise = -noise;
                        Float noise = SampleNormal(rng.Uniform<Float>(), 0., .1);
                        // TODO: use sigma, make this controllable, etc.
                        fprintf(f, "%c%f ", (dx > -width || dy > -width) ? ',' : ' ',
                                image.GetChannel({pixel[0] + dx, pixel[1] + dy}, c)
                                    // *  (.95 + .05 * rng.Uniform<Float>())
                                    + noise);
                    }
                fprintf(f, "\n");
            }
        fclose(f);

        // what it should equal
        f = fopen("b.csv", "w");
        for (int i = 0; i < nInstances; ++i)
            for (int c = 0; c < 3; ++c)
                fprintf(f, "%f\n", image.GetChannel({pixel[0], pixel[1]}, c));
        fclose(f);

        /*
          LeastSquares[Import["m.csv"], Import["b.csv"]]
          ArrayPlot[ArrayReshape[ %, {21, 21}], ColorFunction -> Function[a,
          GrayLevel[4 a]]]
        */
    } else {
        fprintf(stderr, "imgtool: unknown command \"%s\"", argv[1]);
        help();
        CleanupPBRT();
        return 1;
    }